

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
ResetAllocation(InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                *this,Allocation new_allocation,size_type new_size)

{
  bool bVar1;
  iterator pSVar2;
  Allocation *pAVar3;
  allocator_type *a;
  pointer pSVar4;
  pointer pSVar5;
  size_type sVar6;
  Tag *this_00;
  size_type new_size_local;
  InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_> *this_local;
  Allocation new_allocation_local;
  
  new_allocation_local.capacity_ = (size_type)new_allocation.buffer_;
  this_local = (InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
                *)new_allocation.capacity_;
  bVar1 = allocated(this);
  if (bVar1) {
    pSVar4 = allocated_space(this);
    pSVar5 = allocated_space(this);
    sVar6 = size(this);
    Destroy(this,pSVar4,pSVar5 + sVar6);
    pSVar2 = begin(this);
    pSVar4 = allocated_space(this);
    if (pSVar2 != pSVar4) {
      __assert_fail("begin() == allocated_space()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                    ,0x31b,
                    "void absl::InlinedVector<s2shapeutil::ShapeEdge, 16>::ResetAllocation(Allocation, size_type) [T = s2shapeutil::ShapeEdge, N = 16, A = std::allocator<s2shapeutil::ShapeEdge>]"
                   );
    }
    pAVar3 = allocation(this);
    a = allocator(this);
    Allocation::Dealloc(pAVar3,a);
    pAVar3 = allocation(this);
    pAVar3->capacity_ = (size_type)this_local;
    pAVar3->buffer_ = (pointer)new_allocation_local.capacity_;
  }
  else {
    pSVar4 = inlined_space(this);
    pSVar5 = inlined_space(this);
    sVar6 = size(this);
    Destroy(this,pSVar4,pSVar5 + sVar6);
    init_allocation(this,(Allocation *)&this_local);
  }
  this_00 = tag(this);
  Tag::set_allocated_size(this_00,new_size);
  return;
}

Assistant:

void ResetAllocation(Allocation new_allocation, size_type new_size) {
    if (allocated()) {
      Destroy(allocated_space(), allocated_space() + size());
      assert(begin() == allocated_space());
      allocation().Dealloc(allocator());
      allocation() = new_allocation;
    } else {
      Destroy(inlined_space(), inlined_space() + size());
      init_allocation(new_allocation);  // bug: only init once
    }
    tag().set_allocated_size(new_size);
  }